

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chull.cpp
# Opt level: O0

bool masc::polygon::inHull
               (ply_vertex *v,
               list<masc::polygon::ply_vertex_*,_std::allocator<masc::polygon::ply_vertex_*>_> *hull
               )

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  reference pppVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  _List_iterator<masc::polygon::ply_vertex_*> local_50;
  VIT b2;
  VIT b1;
  _List_iterator<masc::polygon::ply_vertex_*> local_38;
  VIT t2;
  _List_iterator<masc::polygon::ply_vertex_*> local_28;
  VIT t1;
  list<masc::polygon::ply_vertex_*,_std::allocator<masc::polygon::ply_vertex_*>_> *hull_local;
  ply_vertex *v_local;
  
  t1._M_node = (_List_node_base *)hull;
  local_28._M_node =
       (_List_node_base *)
       std::__cxx11::list<masc::polygon::ply_vertex_*,_std::allocator<masc::polygon::ply_vertex_*>_>
       ::end(hull);
  t2._M_node = (_List_node_base *)
               std::_List_iterator<masc::polygon::ply_vertex_*>::operator--(&local_28,0);
  local_38._M_node = local_28._M_node;
  std::_List_iterator<masc::polygon::ply_vertex_*>::operator--(&local_38,0);
  pppVar5 = std::_List_iterator<masc::polygon::ply_vertex_*>::operator*(&local_38);
  iVar2 = (*(*pppVar5)->_vptr_ply_vertex[2])();
  pppVar5 = std::_List_iterator<masc::polygon::ply_vertex_*>::operator*(&local_28);
  iVar3 = (*(*pppVar5)->_vptr_ply_vertex[2])();
  iVar4 = (*v->_vptr_ply_vertex[2])();
  bVar1 = turn_left((Point2d *)CONCAT44(extraout_var,iVar2),
                    (Point2d *)CONCAT44(extraout_var_00,iVar3),
                    (Point2d *)CONCAT44(extraout_var_01,iVar4));
  if (bVar1) {
    local_50._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<masc::polygon::ply_vertex_*,_std::allocator<masc::polygon::ply_vertex_*>_>::begin
                   (t1._M_node);
    b2._M_node = local_50._M_node;
    std::_List_iterator<masc::polygon::ply_vertex_*>::operator++(&local_50,0);
    pppVar5 = std::_List_iterator<masc::polygon::ply_vertex_*>::operator*(&b2);
    iVar2 = (*(*pppVar5)->_vptr_ply_vertex[2])();
    pppVar5 = std::_List_iterator<masc::polygon::ply_vertex_*>::operator*(&local_50);
    iVar3 = (*(*pppVar5)->_vptr_ply_vertex[2])();
    iVar4 = (*v->_vptr_ply_vertex[2])();
    v_local._7_1_ =
         turn_left((Point2d *)CONCAT44(extraout_var_02,iVar2),
                   (Point2d *)CONCAT44(extraout_var_03,iVar3),
                   (Point2d *)CONCAT44(extraout_var_04,iVar4));
  }
  else {
    v_local._7_1_ = false;
  }
  return v_local._7_1_;
}

Assistant:

inline bool inHull(ply_vertex * v,list<ply_vertex*>& hull )
{
    typedef list<ply_vertex*>::iterator VIT;
    VIT t1=hull.end(); t1--;
    VIT t2=t1; t2--;
    if( !turn_left((*t2)->getPos(),(*t1)->getPos(),v->getPos()) )
        return false;

    VIT b1=hull.begin();
    VIT b2=b1; b2++;
    return turn_left((*b1)->getPos(),(*b2)->getPos(),v->getPos());
}